

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
CompilerContext::compile_condition(CompilerContext *this,SyntaxTree *node,bool not_flag)

{
  NodeType NVar1;
  SyntaxTree *node_00;
  unreachable_exception *this_00;
  bool not_flag_local;
  SyntaxTree *node_local;
  CompilerContext *this_local;
  
  NVar1 = SyntaxTree::type(node);
  if (NVar1 == Command) {
    compile_command(this,node,not_flag);
  }
  else if (NVar1 == NOT) {
    node_00 = SyntaxTree::child(node,0);
    compile_condition(this,node_00,(bool)((not_flag ^ 0xffU) & 1));
  }
  else {
    if (4 < NVar1 - Equal) {
      this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this_00,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(597)."
                );
      __cxa_throw(this_00,&unreachable_exception::typeinfo,
                  unreachable_exception::~unreachable_exception);
    }
    compile_expr(this,node,not_flag);
  }
  return;
}

Assistant:

void CompilerContext::compile_condition(const SyntaxTree& node, bool not_flag)
{
    // also see compile_conditions
    switch(node.type())
    {
        case NodeType::NOT:
            return compile_condition(node.child(0), !not_flag);
        case NodeType::Command:
            return compile_command(node, not_flag);
        case NodeType::Equal:
        case NodeType::Greater:
        case NodeType::GreaterEqual:
        case NodeType::Lesser:
        case NodeType::LesserEqual:
            return compile_expr(node, not_flag);
        default:
            Unreachable();
    }
}